

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

void matd_plu_destroy(matd_plu_t *mlu)

{
  if (mlu->lu != (matd_t *)0x0) {
    free(mlu->lu);
  }
  free(mlu->piv);
  *(undefined8 *)&mlu->pivsign = 0;
  mlu->lu = (matd_t *)0x0;
  *(undefined8 *)mlu = 0;
  mlu->piv = (uint *)0x0;
  free(mlu);
  return;
}

Assistant:

void matd_plu_destroy(matd_plu_t *mlu)
{
    matd_destroy(mlu->lu);
    free(mlu->piv);
    memset(mlu, 0, sizeof(matd_plu_t));
    free(mlu);
}